

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.h
# Opt level: O2

_HashNode * __thiscall SQTable::_Get(SQTable *this,SQObjectPtr *key,SQHash hash)

{
  _HashNode *p_Var1;
  
  p_Var1 = this->_nodes + hash;
  while (((p_Var1->key).super_SQObject._unVal.pTable != (key->super_SQObject)._unVal.pTable ||
         ((p_Var1->key).super_SQObject._type != (key->super_SQObject)._type))) {
    p_Var1 = p_Var1->next;
    if (p_Var1 == (_HashNode *)0x0) {
      return (_HashNode *)0x0;
    }
  }
  return p_Var1;
}

Assistant:

inline _HashNode *_Get(const SQObjectPtr &key,SQHash hash)
    {
        _HashNode *n = &_nodes[hash];
        do{
            if(_rawval(n->key) == _rawval(key) && sq_type(n->key) == sq_type(key)){
                return n;
            }
        }while((n = n->next));
        return NULL;
    }